

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O1

int __thiscall
FastPForLib::VarIntG8IU::encodeBlock
          (VarIntG8IU *this,uint32_t **src,size_t *srclength,uchar **dest,size_t *dstlength)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  size_t sVar7;
  uint *puVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int aiStack_68 [8];
  uint auStack_48 [2];
  int ithSize [8];
  uint32_t buffer [8];
  
  sVar7 = *srclength;
  puVar8 = *src;
  bVar6 = 0xff;
  uVar11 = 1;
  uVar1 = 0;
  iVar2 = 0;
  while (sVar7 != 0) {
    uVar4 = *puVar8;
    uVar13 = (uint)LZCOUNT(uVar4 | 0xff) >> 3;
    iVar14 = 4 - uVar13;
    iVar2 = iVar14 + iVar2;
    if (8 < iVar2) break;
    bVar10 = (byte)(uVar11 << ((byte)uVar13 ^ 3));
    bVar6 = bVar6 ^ bVar10;
    uVar11 = (uint)(byte)(bVar10 * '\x02');
    aiStack_68[(int)uVar1] = iVar14;
    auStack_48[(int)uVar1] = uVar4;
    puVar8 = puVar8 + 1;
    *src = puVar8;
    sVar7 = sVar7 - 4;
    *srclength = sVar7;
    uVar1 = uVar1 + 1;
  }
  **dest = bVar6;
  if ((int)uVar1 < 1) {
    iVar2 = 1;
  }
  else {
    iVar2 = 1;
    uVar5 = 0;
    do {
      iVar14 = aiStack_68[uVar5];
      if (0 < iVar14) {
        uVar11 = auStack_48[uVar5];
        lVar9 = (long)iVar2;
        uVar4 = 0;
        iVar12 = 0;
        do {
          (*dest)[lVar9] = (uchar)(uVar11 >> (uVar4 & 0x1f));
          lVar9 = lVar9 + 1;
          iVar12 = iVar12 + -1;
          uVar4 = uVar4 + 8;
        } while (-iVar14 != iVar12);
        iVar2 = iVar2 - iVar12;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
  }
  if (iVar2 < 9) {
    lVar9 = (long)iVar2;
    do {
      lVar3 = lVar9 + 1;
      (*dest)[lVar9] = '\0';
      lVar9 = lVar3;
    } while ((int)lVar3 != 9);
  }
  *dest = *dest + 9;
  *dstlength = *dstlength - 9;
  return 9;
}

Assistant:

int encodeBlock(const uint32_t *&src, size_t &srclength, unsigned char *&dest,
                  size_t &dstlength) {
    unsigned char desc = 0xFF;
    unsigned char bitmask = 0x01;
    uint32_t buffer[8];
    int ithSize[8];
    int length = 0;
    int numInt = 0;

    while (srclength > 0) {
      const uint32_t *temp = src;
      int byteNeeded = getNumByteNeeded(*temp);

      if (PREDICT_FALSE(length + byteNeeded > 8)) {
        break;
      }

      // flip the correct bit in desc
      bitmask = static_cast<unsigned char>(bitmask << (byteNeeded - 1));
      desc = desc ^ bitmask;
      bitmask = static_cast<unsigned char>(bitmask << 1);

      ithSize[numInt] = byteNeeded;
      length += byteNeeded;
      buffer[numInt] = *temp;
      src = src + 1;
      srclength -= 4;
      numInt++;
    }

    dest[0] = desc;
    int written = 1;
    for (int i = 0; i < numInt; i++) {
      int size = ithSize[i];
      uint32_t value = buffer[i];
      for (int j = 0; j < size; j++) {
        dest[written] = static_cast<unsigned char>(value >> (j * 8));
        written++;
      }
    }
    while (written < 9) {
      dest[written++] = 0; // clear padding bytes
    }
    dest += 9;
    dstlength -= 9;
    return 9;
  }